

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units::Units(Units *this)

{
  string *local_28;
  Units *this_local;
  
  local_28 = (string *)&this->field_0x48;
  do {
    std::__cxx11::string::string(local_28);
    local_28 = local_28 + 0x20;
  } while (local_28 != (string *)(this + 1));
  this->factors[5] = 448.831;
  std::__cxx11::string::operator=((string *)&this->field_0xe8,"gpm");
  this->factors[4] = 0.4333;
  std::__cxx11::string::operator=((string *)&this->field_0xc8,"psi");
  this->factors[8] = 0.0353145;
  std::__cxx11::string::operator=((string *)&this->field_0x148,"mg/L");
  setOtherFactors(this,0);
  return;
}

Assistant:

Units::Units()
{
    // ... conversion factors for default US units
    factors[FLOW]     = GPMperCFS;
    names[FLOW]       = "gpm";
    factors[PRESSURE] = PSIperFT;
    names[PRESSURE]   = "psi";
    factors[CONCEN]   = FT3perL;
    names[CONCEN]     = "mg/L";
    setOtherFactors(Options::US);
}